

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O1

void blowfish_ssh2_encrypt_blk(ssh_cipher *cipher,void *blk,int len)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  undefined1 *puVar5;
  int iVar6;
  uint32_t out [2];
  uint local_30;
  uint local_2c;
  
  if ((len & 7U) == 0) {
    uVar3 = *(uint *)((long)&cipher[-1].vt + 4);
    uVar4 = *(uint *)&cipher[-1].vt;
    if (0 < len) {
      puVar5 = (undefined1 *)((long)blk + 7);
      iVar6 = len + 8;
      do {
        uVar1 = *(uint *)(puVar5 + -7);
        uVar2 = *(uint *)(puVar5 + -3);
        blowfish_encrypt((uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                         uVar1 << 0x18) ^ uVar4,
                         (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                         uVar2 << 0x18) ^ uVar3,&local_30,(BlowfishContext *)(cipher + -0x20a));
        *(ushort *)(puVar5 + -5) = (ushort)local_30 << 8 | (ushort)local_30 >> 8;
        puVar5[-6] = (char)(local_30 >> 0x10);
        puVar5[-7] = (char)(local_30 >> 0x18);
        *puVar5 = (char)local_2c;
        puVar5[-1] = (char)(local_2c >> 8);
        puVar5[-2] = (char)(local_2c >> 0x10);
        puVar5[-3] = (char)(local_2c >> 0x18);
        puVar5 = puVar5 + 8;
        iVar6 = iVar6 + -8;
        uVar4 = local_30;
        uVar3 = local_2c;
      } while (8 < iVar6);
    }
    *(uint *)&cipher[-1].vt = uVar4;
    *(uint *)((long)&cipher[-1].vt + 4) = uVar3;
    return;
  }
  __assert_fail("(len & 7) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/blowfish.c"
                ,0x17d,"void blowfish_msb_encrypt_cbc(unsigned char *, int, BlowfishContext *)");
}

Assistant:

static void blowfish_ssh2_encrypt_blk(ssh_cipher *cipher, void *blk, int len)
{
    struct blowfish_ctx *ctx = container_of(cipher, struct blowfish_ctx, ciph);
    blowfish_msb_encrypt_cbc(blk, len, &ctx->context);
}